

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readasy.c
# Opt level: O1

int it_asy_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  int iVar1;
  int iVar2;
  char *ptr;
  long n;
  
  if ((sample->flags & 0x10) != 0) {
    iVar2 = sample->loop_end;
    iVar1 = sample->length - iVar2;
    if (iVar1 != 0 && iVar2 <= sample->length) {
      sample->length = iVar2;
      n = (long)iVar1;
      goto LAB_006e9799;
    }
  }
  n = 0;
LAB_006e9799:
  iVar2 = sample->length;
  ptr = (char *)malloc((long)iVar2);
  sample->data = ptr;
  if (ptr != (char *)0x0) {
    if (iVar2 != 0) {
      dumbfile_getnc(ptr,iVar2,f);
    }
    dumbfile_skip(f,n);
    iVar2 = dumbfile_error(f);
    return iVar2;
  }
  return -1;
}

Assistant:

static int it_asy_read_sample_data( IT_SAMPLE *sample, DUMBFILE *f )
{
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ( ( sample->flags & IT_SAMPLE_LOOP ) && sample->loop_end < sample->length ) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc( sample->length );

	if ( !sample->data )
		return -1;

	if ( sample->length )
		dumbfile_getnc( sample->data, sample->length, f );

	dumbfile_skip( f, truncated_size );

	return dumbfile_error( f );
}